

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.cpp
# Opt level: O2

void __thiscall net_uv::UVLoop::alloc_buf(UVLoop *this,uv_buf_t *buf,size_t size)

{
  char *pcVar1;
  const_iterator __position;
  list<uv_buf_t,_std::allocator<uv_buf_t>_> *this_00;
  
  this_00 = &this->m_freeReadBufList;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      pcVar1 = (char *)malloc(size);
      buf->base = pcVar1;
      buf->len = size;
      return;
    }
  } while (__position._M_node[1]._M_prev != (_List_node_base *)size);
  buf->base = (char *)__position._M_node[1]._M_next;
  buf->len = size;
  std::__cxx11::list<uv_buf_t,_std::allocator<uv_buf_t>_>::erase(this_00,__position);
  return;
}

Assistant:

void UVLoop::alloc_buf(uv_buf_t* buf, size_t size)
{
	for (auto it = m_freeReadBufList.begin(); it != m_freeReadBufList.end(); ++it)
	{
		if (it->len == size)
		{
			buf->base = it->base;
			buf->len = it->len;
			m_freeReadBufList.erase(it);
			return;
		}
	}

	buf->base = (char*)fc_malloc(size);
	buf->len = size;
}